

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O1

UINT32 NES_DMC_np_Render(void *chip,INT32 *b)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  short sVar16;
  ulong uVar17;
  bool bVar18;
  INT32 m [3];
  int local_34 [3];
  
  uVar17 = *(long *)((long)chip + 0x40120) + *(long *)((long)chip + 0x40118);
  *(ulong *)((long)chip + 0x40120) = uVar17 & 0xffffffff;
  iVar12 = (int)(uVar17 >> 0x20);
  iVar2 = *(int *)((long)chip + 0x40100) + iVar12;
  *(int *)((long)chip + 0x40100) = iVar2;
  if (*(int *)((long)chip + 0x40104) < iVar2) {
    do {
      FrameSequence((NES_DMC *)chip,*(int *)((long)chip + 0x40108));
      iVar2 = *(int *)((long)chip + 0x40100) - *(int *)((long)chip + 0x40104);
      *(int *)((long)chip + 0x40100) = iVar2;
      iVar8 = *(int *)((long)chip + 0x40108) + 1;
      if (*(int *)((long)chip + 0x4010c) <= iVar8) {
        iVar8 = 0;
      }
      *(int *)((long)chip + 0x40108) = iVar8;
    } while (*(int *)((long)chip + 0x40104) < iVar2);
  }
  if (((*(int *)((long)chip + 0x400c4) < 1) || (*(int *)((long)chip + 0x400f0) < 1)) ||
     ((*(int *)((long)chip + 0x40020) != 0 && (*(int *)((long)chip + 0x400c0) == 0)))) {
    if ((*(int *)((long)chip + 0x40024) != 0) &&
       (uVar4 = *(uint *)((long)chip + 0x400b4), (int)uVar4 < 0x1f && uVar4 != 0)) {
      uVar11 = *(int *)((long)chip + 0x400a8) + iVar12;
      uVar3 = *(uint *)((long)chip + 0x400c0);
      if (uVar3 < uVar11) {
        do {
          if (uVar4 == 0) break;
          uVar4 = uVar4 + 1 & 0x1f;
          *(uint *)((long)chip + 0x400b4) = uVar4;
          uVar11 = uVar11 + ~uVar3;
        } while (uVar3 < uVar11);
      }
      *(uint *)((long)chip + 0x400a8) = uVar11;
    }
  }
  else {
    uVar3 = *(int *)((long)chip + 0x400a8) + iVar12;
    uVar4 = *(uint *)((long)chip + 0x400c0);
    if (uVar4 < uVar3) {
      uVar11 = *(uint *)((long)chip + 0x400b4);
      do {
        uVar3 = uVar3 + ~uVar4;
        uVar11 = uVar11 + 1 & 0x1f;
      } while (uVar4 < uVar3);
      *(uint *)((long)chip + 0x400b4) = uVar11;
    }
    *(uint *)((long)chip + 0x400a8) = uVar3;
  }
  uVar4 = *(uint *)(calc_tri_tritbl + (long)*(int *)((long)chip + 0x400b4) * 4);
  *(uint *)((long)chip + 0x40068) = uVar4;
  puVar6 = (uint *)((long)chip + 0x400d0);
  if (*(char *)((long)chip + 0x400dd) == '\0') {
    puVar6 = (uint *)((long)chip + 0x400e8);
  }
  uVar3 = 0;
  if (0 < *(int *)((long)chip + 0x400f4)) {
    uVar3 = *puVar6;
  }
  uVar11 = *(uint *)((long)chip + 0x400d4);
  uVar5 = (int)(uVar11 << 0x11) >> 0x1f & uVar3;
  if (uVar17 >> 0x20 != 0) {
    uVar9 = *(int *)((long)chip + 0x400ac) + iVar12;
    *(uint *)((long)chip + 0x400ac) = uVar9;
    uVar15 = *(uint *)((long)chip + 0x400b8);
    if (uVar15 != 0) {
      iVar2 = 0;
      if (uVar9 < uVar15) {
        iVar8 = 0;
      }
      else {
        iVar8 = 0;
        iVar2 = 0;
        do {
          uVar11 = ((uint)((uVar11 & *(uint *)((long)chip + 0x400d8)) != 0) ^ uVar11 & 1) << 0xe |
                   uVar11 >> 1;
          iVar2 = iVar2 + 1;
          iVar8 = iVar8 + uVar5;
          uVar5 = (int)(uVar11 << 0x11) >> 0x1f & uVar3;
          uVar9 = uVar9 - uVar15;
        } while (uVar15 <= uVar9);
        *(uint *)((long)chip + 0x400d4) = uVar11;
        *(uint *)((long)chip + 0x400ac) = uVar9;
      }
      if (iVar2 != 0) {
        uVar5 = (uVar5 * iVar2 * uVar9 + (iVar12 - uVar9) * iVar8) / (uint)(iVar2 * iVar12);
      }
    }
  }
  *(uint *)((long)chip + 0x4006c) = uVar5;
  uVar3 = *(uint *)((long)chip + 0x400bc);
  uVar11 = *(int *)((long)chip + 0x400b0) + iVar12;
  *(uint *)((long)chip + 0x400b0) = uVar11;
  if (uVar3 - 1 < uVar11) {
    iVar2 = *(int *)((long)chip + 0x40078);
    uVar15 = *(uint *)((long)chip + 0x4007c);
    do {
      if (uVar15 != 0x100) {
        sVar1 = *(short *)((long)chip + 0x40080);
        if ((uVar15 & 1) == 0) {
          sVar16 = -1;
          if (0 < sVar1) {
LAB_0016152c:
            *(short *)((long)chip + 0x40080) = sVar16 + sVar1;
          }
        }
        else {
          sVar16 = 1;
          if (sVar1 < 0x3f) goto LAB_0016152c;
        }
        uVar15 = uVar15 >> 1;
        *(uint *)((long)chip + 0x4007c) = uVar15;
      }
      if ((uVar15 == 0x100) && (*(char *)((long)chip + 0x400a5) != '\0')) {
        uVar15 = *(byte *)(*(long *)((long)chip + 0x40060) + (ulong)*(uint *)((long)chip + 0x40074))
                 | 0x10000;
        *(uint *)((long)chip + 0x4007c) = uVar15;
        if (iVar2 != 0) {
          *(uint *)((long)chip + 0x40074) = *(uint *)((long)chip + 0x40074) + 1 & 0xffff | 0x8000;
          iVar2 = iVar2 + -1;
          *(int *)((long)chip + 0x40078) = iVar2;
        }
      }
      if (iVar2 == 0) {
        if ((*(uint *)((long)chip + 0x400a0) & 1) == 0) {
          if (*(uint *)((long)chip + 0x400a0) == 2) {
            bVar18 = *(char *)((long)chip + 0x400a5) != '\0';
          }
          else {
            bVar18 = false;
          }
          *(bool *)((long)chip + 0x400a4) = bVar18;
          *(undefined1 *)((long)chip + 0x400a5) = 0;
        }
        else {
          *(uint *)((long)chip + 0x40074) = *(int *)((long)chip + 0x40058) << 6 | 0xc000;
          iVar2 = *(int *)((long)chip + 0x40054) * 0x10 + 1;
          *(int *)((long)chip + 0x40078) = iVar2;
        }
      }
      iVar12 = uVar11 - uVar3;
      uVar11 = uVar11 - uVar3;
      *(int *)((long)chip + 0x400b0) = iVar12;
    } while (uVar3 <= uVar11);
  }
  uVar3 = *(uint *)((long)chip + 0x40028);
  uVar13 = 0;
  uVar17 = (ulong)uVar4;
  if ((uVar3 & 1) != 0) {
    uVar17 = uVar13;
  }
  uVar7 = (ulong)uVar5;
  if ((uVar3 & 2) != 0) {
    uVar7 = uVar13;
  }
  *(int *)((long)chip + 0x40068) = (int)uVar17;
  uVar10 = (ulong)(uint)(*(short *)((long)chip + 0x40080) * 2 + *(int *)((long)chip + 0x40084));
  if ((uVar3 & 4) != 0) {
    uVar10 = uVar13;
  }
  *(int *)((long)chip + 0x4006c) = (int)uVar7;
  *(int *)((long)chip + 0x40070) = (int)uVar10;
  local_34[0] = *(int *)((long)chip + uVar17 * 0x2000 + 8);
  local_34[1] = *(int *)((long)chip + uVar7 * 0x200 + 8);
  local_34[2] = *(int *)((long)chip + uVar10 * 4 + 8);
  if (*(int *)((long)chip + 0x4000c) != 0) {
    iVar2 = *(int *)((long)chip + uVar10 * 4 + uVar7 * 0x200 + uVar17 * 0x2000 + 0x20008);
    iVar12 = local_34[1] + local_34[0] + local_34[2];
    if (iVar12 == 0) {
      lVar14 = 0;
      do {
        local_34[lVar14] = iVar2;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
    }
    else {
      lVar14 = 0;
      do {
        local_34[lVar14] = (local_34[lVar14] * iVar2) / iVar12;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
    }
  }
  if (*(int *)((long)chip + 0x40018) != 0) {
    if (*(char *)((long)chip + 0x40088) != '\0') {
      iVar2 = (*(int *)((long)chip + 0x40090) - local_34[2]) + *(int *)((long)chip + 0x4008c);
      *(int *)((long)chip + 0x4008c) = iVar2;
      *(undefined1 *)((long)chip + 0x40088) = 0;
      if (0x3ffc0000 < iVar2) {
        *(undefined4 *)((long)chip + 0x4008c) = 0x3ffc0000;
      }
      if (*(int *)((long)chip + 0x4008c) < -0x3ffc0000) {
        *(undefined4 *)((long)chip + 0x4008c) = 0xc0040000;
      }
    }
    *(int *)((long)chip + 0x40090) = local_34[2];
    iVar2 = *(int *)((long)chip + 0x4008c);
    local_34[2] = local_34[2] + iVar2;
    iVar12 = -1;
    if (iVar2 < 1) {
      if (-1 < iVar2) goto LAB_0016176b;
      iVar12 = 1;
    }
    *(int *)((long)chip + 0x4008c) = iVar2 + iVar12;
  }
LAB_0016176b:
  iVar2 = *(int *)((long)chip + 0x4002c) * local_34[0];
  *b = iVar2;
  iVar2 = *(int *)((long)chip + 0x40030) * local_34[1] + iVar2;
  *b = iVar2;
  *b = iVar2 - *(int *)((long)chip + 0x40034) * local_34[2] >> 5;
  local_34[0] = local_34[0] * *(int *)((long)chip + 0x40038);
  b[1] = local_34[0];
  local_34[0] = local_34[1] * *(int *)((long)chip + 0x4003c) + local_34[0];
  b[1] = local_34[0];
  b[1] = local_34[0] - local_34[2] * *(int *)((long)chip + 0x40040) >> 5;
  return 2;
}

Assistant:

UINT32 NES_DMC_np_Render(void* chip, INT32 b[2])
{
	NES_DMC* dmc = (NES_DMC*)chip;
	UINT32 clocks;
	INT32 m[3];

	RC_STEP(&dmc->tick_count);
	clocks = RC_GET_VAL(&dmc->tick_count);
	RC_MASK(&dmc->tick_count);
	TickFrameSequence(dmc, clocks);
	Tick(dmc, clocks);

	dmc->out[0] = (dmc->mask & 1) ? 0 : dmc->out[0];
	dmc->out[1] = (dmc->mask & 2) ? 0 : dmc->out[1];
	dmc->out[2] = (dmc->mask & 4) ? 0 : dmc->out[2];

	m[0] = dmc->tnd_table[0][dmc->out[0]][0][0];
	m[1] = dmc->tnd_table[0][0][dmc->out[1]][0];
	m[2] = dmc->tnd_table[0][0][0][dmc->out[2]];

	if (dmc->option[OPT_NONLINEAR_MIXER])
	{
		INT32 ref = m[0] + m[1] + m[2];
		INT32 voltage = dmc->tnd_table[1][dmc->out[0]][dmc->out[1]][dmc->out[2]];
		int i;
		if (ref)
		{
			for (i=0; i < 3; ++i)
				m[i] = (m[i] * voltage) / ref;
		}
		else
		{
			for (i=0; i < 3; ++i)
				m[i] = voltage;
		}
	}

	// anti-click nullifies any 4011 write but preserves nonlinearity
	if (dmc->option[OPT_DPCM_ANTI_CLICK])
	{
		if (dmc->dmc_pop) // $4011 will cause pop this frame
		{
			// adjust offset to counteract pop
			dmc->dmc_pop_offset += dmc->dmc_pop_follow - m[2];
			dmc->dmc_pop = false;

			// prevent overflow, keep headspace at edges
			//const INT32 OFFSET_MAX = (1 << 30) - (4 << 16);
#define OFFSET_MAX	((1 << 30) - (4 << 16))
			if (dmc->dmc_pop_offset >  OFFSET_MAX) dmc->dmc_pop_offset =  OFFSET_MAX;
			if (dmc->dmc_pop_offset < -OFFSET_MAX) dmc->dmc_pop_offset = -OFFSET_MAX;
		}
		dmc->dmc_pop_follow = m[2]; // remember previous position

		m[2] += dmc->dmc_pop_offset; // apply offset

		// TODO implement this in a better way
		// roll off offset (not ideal, but prevents overflow)
		if (dmc->dmc_pop_offset > 0) --dmc->dmc_pop_offset;
		else if (dmc->dmc_pop_offset < 0) ++dmc->dmc_pop_offset;
	}

	b[0]  = m[0] * dmc->sm[0][0];
	b[0] += m[1] * dmc->sm[0][1];
	b[0] +=-m[2] * dmc->sm[0][2];
	b[0] >>= 7-2;

	b[1]  = m[0] * dmc->sm[1][0];
	b[1] += m[1] * dmc->sm[1][1];
	b[1] +=-m[2] * dmc->sm[1][2];
	b[1] >>= 7-2;

	return 2;
}